

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defyx.cpp
# Opt level: O0

defyx_cache * defyx_alloc_cache(defyx_flags flags)

{
  char cVar1;
  uint uVar2;
  defyx_cache *__s;
  defyx_cache *pdVar3;
  JitCompiler *pJVar4;
  DatasetInitFunc *pDVar5;
  uint8_t *puVar6;
  char *pcVar7;
  defyx_cache *pdVar8;
  long unaff_RBX;
  uint in_EDI;
  defyx_cache *in_stack_00000030;
  long in_stack_00000038;
  long in_stack_00000040;
  exception *ex;
  defyx_cache *cache;
  defyx_cache *in_stack_ffffffffffffff90;
  JitCompilerX86 *in_stack_ffffffffffffffb0;
  
  __s = (defyx_cache *)operator_new(0x2130);
  memset(__s,0,0x2130);
  pdVar8 = __s;
  defyx_cache::defyx_cache(in_stack_ffffffffffffff90);
  uVar2 = in_EDI & 9;
  pdVar3 = (defyx_cache *)
           ((long)&switchD_0012c3bd::switchdataD_00161550 +
           (long)(int)(&switchD_0012c3bd::switchdataD_00161550)[(long)(ulong)uVar2]);
  switch(uVar2) {
  case 0:
    __s->dealloc = defyx::deallocCache<defyx::AlignedAllocator<64ul>>;
    __s->jit = (JitCompiler *)0x0;
    __s->initialize = defyx::initCache;
    __s->datasetInit = defyx::initDataset;
    puVar6 = (uint8_t *)
             defyx::AlignedAllocator<64UL>::allocMemory((size_t)in_stack_ffffffffffffff90);
    __s->memory = puVar6;
    break;
  case 1:
    __s->dealloc = defyx::deallocCache<defyx::LargePageAllocator>;
    __s->jit = (JitCompiler *)0x0;
    __s->initialize = defyx::initCache;
    __s->datasetInit = defyx::initDataset;
    puVar6 = (uint8_t *)defyx::LargePageAllocator::allocMemory(0x12c527);
    __s->memory = puVar6;
    break;
  case 8:
    __s->dealloc = defyx::deallocCache<defyx::AlignedAllocator<64ul>>;
    pJVar4 = (JitCompiler *)operator_new(0x48);
    defyx::JitCompilerX86::JitCompilerX86(in_stack_ffffffffffffffb0);
    __s->jit = pJVar4;
    __s->initialize = defyx::initCacheCompile;
    pDVar5 = defyx::JitCompilerX86::getDatasetInitFunc(__s->jit);
    __s->datasetInit = pDVar5;
    puVar6 = (uint8_t *)
             defyx::AlignedAllocator<64UL>::allocMemory((size_t)in_stack_ffffffffffffff90);
    __s->memory = puVar6;
    break;
  case 9:
    __s->dealloc = defyx::deallocCache<defyx::LargePageAllocator>;
    pJVar4 = (JitCompiler *)operator_new(0x48);
    defyx::JitCompilerX86::JitCompilerX86(in_stack_ffffffffffffffb0);
    __s->jit = pJVar4;
    __s->initialize = defyx::initCacheCompile;
    pDVar5 = defyx::JitCompilerX86::getDatasetInitFunc(__s->jit);
    __s->datasetInit = pDVar5;
    puVar6 = (uint8_t *)defyx::LargePageAllocator::allocMemory(0x12c5b8);
    __s->memory = puVar6;
    break;
  case 10:
    pcVar7 = (char *)((ulong)pdVar3 & 0xffffffffffffffc4);
    cVar1 = (char)pcVar7;
    *pcVar7 = *pcVar7 + cVar1;
    *(char *)(unaff_RBX + -0x76b7f020) = *(char *)(unaff_RBX + -0x76b7f020) + cVar1;
    *pcVar7 = *pcVar7 + cVar1;
    pcVar7[-0x75] = pcVar7[-0x75] + 'P';
    *pcVar7 = *pcVar7 + cVar1;
    pcVar7[-0x73] = pcVar7[-0x73] + 'P';
    pdVar8 = (defyx_cache *)
             (*(code *)((long)&switchD_0012c3bd::switchdataD_00161550 +
                       (long)(int)(&switchD_0012c3bd::switchdataD_00161550)[(uint)pcVar7 | 0x34bbd])
             )();
    return pdVar8;
  case 0xb:
    goto LAB_0012cf4f;
  case 0xc:
    goto LAB_0012cf4f;
  case 0xd:
    goto LAB_0012cf4f;
  case 0xe:
    *(char *)&pdVar3->memory = *(char *)&pdVar3->memory + (char)pdVar3;
    in_stack_00000030 = pdVar3;
    goto LAB_0012cf4f;
  case 0xf:
    memset(pdVar8,0,0xc80);
    defyx::InterpretedLightVm<defyx::LargePageAllocator,_true>::InterpretedLightVm
              ((InterpretedLightVm<defyx::LargePageAllocator,_true> *)in_stack_ffffffffffffff90);
    in_stack_00000030 = (defyx_cache *)(ulong)uVar2;
LAB_0012cf4f:
    if (in_stack_00000040 != 0) {
      (**(code **)(in_stack_00000030->memory + 0x28))(in_stack_00000030,in_stack_00000040);
      std::__cxx11::string::operator=
                ((string *)(in_stack_00000030->programs[0].programBuffer + 0x7c),
                 (string *)(in_stack_00000040 + 0x2110));
    }
    if (in_stack_00000038 != 0) {
      (**(code **)(in_stack_00000030->memory + 0x20))(in_stack_00000030,in_stack_00000038);
    }
    (**(code **)(in_stack_00000030->memory + 0x10))();
    return in_stack_00000030;
  }
  return __s;
}

Assistant:

defyx_cache *defyx_alloc_cache(defyx_flags flags) {
		defyx_cache *cache;

		try {
			cache = new defyx_cache();
			switch (flags & (RANDOMX_FLAG_JIT | RANDOMX_FLAG_LARGE_PAGES)) {
				case RANDOMX_FLAG_DEFAULT:
					cache->dealloc = &defyx::deallocCache<defyx::DefaultAllocator>;
					cache->jit = nullptr;
					cache->initialize = &defyx::initCache;
					cache->datasetInit = &defyx::initDataset;
					cache->memory = (uint8_t*)defyx::DefaultAllocator::allocMemory(defyx::CacheSize);
					break;

				case RANDOMX_FLAG_JIT:
					cache->dealloc = &defyx::deallocCache<defyx::DefaultAllocator>;
					cache->jit = new defyx::JitCompiler();
					cache->initialize = &defyx::initCacheCompile;
					cache->datasetInit = cache->jit->getDatasetInitFunc();
					cache->memory = (uint8_t*)defyx::DefaultAllocator::allocMemory(defyx::CacheSize);
					break;

				case RANDOMX_FLAG_LARGE_PAGES:
					cache->dealloc = &defyx::deallocCache<defyx::LargePageAllocator>;
					cache->jit = nullptr;
					cache->initialize = &defyx::initCache;
					cache->datasetInit = &defyx::initDataset;
					cache->memory = (uint8_t*)defyx::LargePageAllocator::allocMemory(defyx::CacheSize);
					break;

				case RANDOMX_FLAG_JIT | RANDOMX_FLAG_LARGE_PAGES:
					cache->dealloc = &defyx::deallocCache<defyx::LargePageAllocator>;
					cache->jit = new defyx::JitCompiler();
					cache->initialize = &defyx::initCacheCompile;
					cache->datasetInit = cache->jit->getDatasetInitFunc();
					cache->memory = (uint8_t*)defyx::LargePageAllocator::allocMemory(defyx::CacheSize);
					break;

				default:
					UNREACHABLE;
			}
		}
		catch (std::exception &ex) {
			if (cache != nullptr) {
				defyx_release_cache(cache);
				cache = nullptr;
			}
		}

		return cache;
	}